

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::LowerJumpTableMultiBranch(Lowerer *this,MultiBranchInstr *multiBrInstr,RegOpnd *indexOpnd)

{
  Func *pFVar1;
  void *pvVar2;
  code *pcVar3;
  bool bVar4;
  BYTE scale;
  byte bVar5;
  RegOpnd *dst;
  LabelInstr *labelInstr;
  LabelOpnd *src;
  RegOpnd *baseOpnd;
  undefined4 *puVar6;
  IndirOpnd *src_00;
  Instr *pIVar7;
  Opnd *this_00;
  
  pFVar1 = this->m_func;
  dst = IR::RegOpnd::New(TyUint64,pFVar1);
  labelInstr = IR::LabelInstr::New(Label,this->m_func,false);
  labelInstr->field_0x78 = labelInstr->field_0x78 | 8;
  src = IR::LabelOpnd::New(labelInstr,this->m_func);
  baseOpnd = IR::RegOpnd::New(TyUint64,pFVar1);
  InsertMove(&baseOpnd->super_Opnd,&src->super_Opnd,(Instr *)multiBrInstr,true);
  pvVar2 = multiBrInstr->m_branchTargets;
  if (*(long *)((long)pvVar2 + 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x27ee,"(branchJumpTable->labelInstr == nullptr)",
                       "Should not be already assigned");
    if (!bVar4) goto LAB_005dae54;
    *puVar6 = 0;
  }
  *(LabelInstr **)((long)pvVar2 + 0x10) = labelInstr;
  scale = LowererMDArch::GetDefaultIndirScale();
  src_00 = IR::IndirOpnd::New(baseOpnd,indexOpnd,scale,TyInt64,this->m_func);
  pIVar7 = InsertMove(&dst->super_Opnd,&src_00->super_Opnd,(Instr *)multiBrInstr,true);
  this_00 = pIVar7->m_dst;
  if ((multiBrInstr->super_BranchInstr).super_Instr.m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_005dae54;
    *puVar6 = 0;
  }
  pFVar1 = (multiBrInstr->super_BranchInstr).super_Instr.m_func;
  if (this_00->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_005dae54:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  bVar5 = this_00->field_0xb;
  if ((bVar5 & 2) != 0) {
    this_00 = IR::Opnd::Copy(this_00,pFVar1);
    bVar5 = this_00->field_0xb;
  }
  this_00->field_0xb = bVar5 | 2;
  (multiBrInstr->super_BranchInstr).super_Instr.m_src1 = this_00;
  (multiBrInstr->super_BranchInstr).super_Instr.m_opcode = JMP;
  return;
}

Assistant:

void
Lowerer::LowerJumpTableMultiBranch(IR::MultiBranchInstr * multiBrInstr, IR::RegOpnd * indexOpnd)
{
    Func * func = this->m_func;
    IR::Opnd * opndDst = IR::RegOpnd::New(TyMachPtr, func);
    //Move the native address of the jump table to a register
    IR::LabelInstr * nativeJumpTableLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    nativeJumpTableLabel->m_isDataLabel = true;
    IR::LabelOpnd * nativeJumpTable = IR::LabelOpnd::New(nativeJumpTableLabel, m_func);
    IR::RegOpnd * nativeJumpTableReg = IR::RegOpnd::New(TyMachPtr, func);
    InsertMove(nativeJumpTableReg, nativeJumpTable, multiBrInstr);

    BranchJumpTableWrapper * branchJumpTable = multiBrInstr->GetBranchJumpTable();
    AssertMsg(branchJumpTable->labelInstr == nullptr, "Should not be already assigned");
    branchJumpTable->labelInstr = nativeJumpTableLabel;

    //Indirect addressing @ target location in the jump table.
    //MOV eax, [nativeJumpTableReg + (offset * indirScale)]
    BYTE indirScale = this->m_lowererMD.GetDefaultIndirScale();
    IR::Opnd * opndSrc = IR::IndirOpnd::New(nativeJumpTableReg, indexOpnd, indirScale, TyMachReg, this->m_func);

    IR::Instr * indirInstr = InsertMove(opndDst, opndSrc, multiBrInstr);

    //MultiBr eax
    multiBrInstr->SetSrc1(indirInstr->GetDst());

    //Jump to the address at the target location in the jump table
    multiBrInstr->m_opcode = LowererMD::MDMultiBranchOpcode;
}